

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

size_t textblock_calculate_lines
                 (textblock *tb,size_t **line_starts,size_t **line_lengths,size_t width)

{
  size_t sVar1;
  wchar_t *local_80;
  size_t adjusted_line_length;
  size_t next_line_start_offset;
  size_t current_line_start;
  size_t breaking_char_offset;
  size_t current_line_length;
  size_t current_line_index;
  size_t total_lines;
  size_t alloc_lines;
  size_t text_offset;
  wchar_t *text;
  size_t width_local;
  size_t **line_lengths_local;
  size_t **line_starts_local;
  textblock *tb_local;
  
  text_offset = 0;
  alloc_lines = 0;
  total_lines = 0;
  current_line_index = 0;
  current_line_length = 0;
  breaking_char_offset = 0;
  current_line_start = 0;
  if ((((tb == (textblock *)0x0) || (line_starts == (size_t **)0x0)) ||
      (line_lengths == (size_t **)0x0)) || (width == 0)) {
    tb_local = (textblock *)0x0;
  }
  else {
    text = (wchar_t *)width;
    width_local = (size_t)line_lengths;
    line_lengths_local = line_starts;
    line_starts_local = (size_t **)tb;
    text_offset = (size_t)textblock_text(tb);
    if (((wchar_t *)text_offset == (wchar_t *)0x0) || (line_starts_local[2] == (size_t *)0x0)) {
      tb_local = (textblock *)0x0;
    }
    else {
      new_line(line_lengths_local,(size_t **)width_local,&total_lines,&current_line_index,0,0);
      while (alloc_lines < line_starts_local[2]) {
        if (*(int *)(text_offset + alloc_lines * 4) == 10) {
          *(size_t *)(*(long *)width_local + current_line_length * 8) = breaking_char_offset;
          new_line(line_lengths_local,(size_t **)width_local,&total_lines,&current_line_index,
                   alloc_lines + 1,0);
          current_line_length = current_line_length + 1;
          breaking_char_offset = 0;
        }
        else {
          if (*(int *)(text_offset + alloc_lines * 4) == 0x20) {
            current_line_start = alloc_lines;
          }
          breaking_char_offset = breaking_char_offset + 1;
        }
        if ((wchar_t *)breaking_char_offset == text) {
          if ((*line_lengths_local)[current_line_length] < current_line_start) {
            local_80 = (wchar_t *)(current_line_start - (*line_lengths_local)[current_line_length]);
            sVar1 = current_line_start;
          }
          else {
            local_80 = text;
            sVar1 = alloc_lines;
          }
          alloc_lines = sVar1 + 1;
          adjusted_line_length = sVar1 + 1;
          *(wchar_t **)(*(long *)width_local + current_line_length * 8) = local_80;
          new_line(line_lengths_local,(size_t **)width_local,&total_lines,&current_line_index,
                   adjusted_line_length,0);
          current_line_length = current_line_length + 1;
          breaking_char_offset = 0;
        }
        else {
          *(size_t *)(*(long *)width_local + current_line_length * 8) = breaking_char_offset;
          alloc_lines = alloc_lines + 1;
        }
      }
      if (*(long *)(*(long *)width_local + (current_line_index - 1) * 8) == 0) {
        current_line_index = current_line_index - 1;
      }
      tb_local = (textblock *)current_line_index;
    }
  }
  return (size_t)tb_local;
}

Assistant:

size_t textblock_calculate_lines(textblock *tb, size_t **line_starts, size_t **line_lengths, size_t width)
{
	const wchar_t *text = NULL;
	size_t text_offset = 0;
	size_t alloc_lines = 0;
	size_t total_lines = 0;
	size_t current_line_index = 0;
	size_t current_line_length = 0;
	size_t breaking_char_offset = 0;

	if (tb == NULL || line_starts == NULL || line_lengths == NULL || width == 0)
		return 0;

	text = textblock_text(tb);

	if (text == NULL || tb->strlen == 0)
		return 0;

	/* Start a line, since we have at least one. */
	new_line(line_starts, line_lengths, &alloc_lines, &total_lines, 0, 0);

	while (text_offset < tb->strlen) {
		if (text[text_offset] == L'\n') {
			(*line_lengths)[current_line_index] = current_line_length;
			new_line(line_starts, line_lengths, &alloc_lines, &total_lines, text_offset + 1, 0);
			current_line_index++;
			current_line_length = 0;
		}
		else if (text[text_offset] == L' ') {
			breaking_char_offset = text_offset;
			current_line_length++;
		}
		else {
			current_line_length++;
		}

		if (current_line_length == width) {
			/* We're out of space on the line and need to break it. */

			size_t const current_line_start = (*line_starts)[current_line_index];
			size_t next_line_start_offset = 0;
			size_t adjusted_line_length = 0;

			if (breaking_char_offset > current_line_start) {
				/* If we found a breaking character on the current line, break
				 * there and start the next line on the next character. The loop
				 * then backtracks to add the already-processed characters to
				 * the next line. */
				adjusted_line_length = breaking_char_offset - current_line_start;
				next_line_start_offset = breaking_char_offset + 1;
				text_offset = breaking_char_offset + 1;
			}
			else {
				/* There was no breaking character on the current line, so we
				 * just break at the current character. This can happen with a 
				 * word that takes up the whole line, for example. */
				adjusted_line_length = width;
				next_line_start_offset = text_offset + 1;
				text_offset++;
			}

			(*line_lengths)[current_line_index] = adjusted_line_length;
			new_line(line_starts, line_lengths, &alloc_lines, &total_lines, next_line_start_offset, 0);
			current_line_index++;
			current_line_length = 0;
		}
		else {
			/* There is still space on the line, so just add the character. */
			(*line_lengths)[current_line_index] = current_line_length;
			text_offset++;
		}
	}

	/* Trim the last line if it doesn't contain any characters. */
	if ((*line_lengths)[total_lines - 1] == 0)
		total_lines--;

	return total_lines;
}